

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O0

bool __thiscall wasm::SortedVector::erase(SortedVector *this,Index x)

{
  bool bVar1;
  reference puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  iterator __last;
  size_type sVar3;
  bool bVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  uint *local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> it;
  Index x_local;
  SortedVector *this_local;
  
  it._M_current._4_4_ = x;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  local_28 = std::
             lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (local_30,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_38,(uint *)((long)&it._M_current + 4));
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  bVar4 = false;
  if (bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_28);
    bVar4 = *puVar2 == it._M_current._4_4_;
  }
  if (bVar4) {
    __first = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator+(&local_28,1);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                       (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    move<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__first,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__last._M_current,local_28);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,sVar3 - 1);
  }
  return bVar4;
}

Assistant:

bool erase(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it != end() && *it == x) {
      std::move(it + 1, end(), it);
      resize(size() - 1);
      return true;
    }
    return false;
  }